

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

uint8_t m256v_LU_det(m256v *LU)

{
  uint8_t a;
  long lVar1;
  
  if (0 < LU->n_col) {
    a = '\x01';
    lVar1 = 0;
    do {
      a = gf256_mul(a,LU->e[lVar1 + LU->rstride * lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < LU->n_col);
    return a;
  }
  return '\x01';
}

Assistant:

MV_GEN_ELTYPE MV_GEN_N(_LU_det)(const MV_GEN_TYPE* LU)
{
	assert(LU->n_row == LU->n_col);

	MV_GEN_ELTYPE det = 1;
	for (int i = 0; i < LU->n_col; ++i) {
		det = fmul(det, MV_GEN_N(_get_el)(LU, i, i));
	}

	return det;
}